

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_cell_face(REF_GRID ref_grid)

{
  int *piVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  byte bVar7;
  REF_FACE pRVar8;
  void *pvVar9;
  uint uVar10;
  long lVar11;
  REF_CELL *ppRVar12;
  int iVar13;
  undefined8 uVar14;
  long lVar15;
  REF_STATUS ref_private_macro_code_rss;
  ulong uVar16;
  char *pcVar17;
  int local_7c;
  REF_INT nodes [4];
  REF_FACE ref_face;
  void *local_58;
  int local_4c;
  REF_NODE local_48;
  REF_CELL *local_40;
  long local_38;
  
  pRVar3 = ref_grid->node;
  uVar10 = ref_face_create(&ref_face,ref_grid);
  pRVar8 = ref_face;
  if (uVar10 == 0) {
    if ((long)ref_face->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x122,"ref_validation_cell_face","malloc hits of REF_INT negative");
      return 1;
    }
    local_58 = malloc((long)ref_face->n << 2);
    if (local_58 == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x122,"ref_validation_cell_face","malloc hits of REF_INT NULL");
      return 2;
    }
    for (lVar11 = 0; local_7c = (int)lVar11, lVar11 < pRVar8->n; lVar11 = lVar11 + 1) {
      *(undefined4 *)((long)local_58 + lVar11 * 4) = 0;
    }
    local_40 = ref_grid->cell;
    ppRVar12 = ref_grid->cell + 8;
    lVar11 = 8;
    local_48 = pRVar3;
    while (pvVar9 = local_58, lVar11 != 0x10) {
      pRVar4 = *ppRVar12;
      iVar13 = 0;
      local_38 = lVar11;
      while (iVar13 < pRVar4->max) {
        local_4c = iVar13;
        if (pRVar4->c2n[(long)pRVar4->size_per * (long)iVar13] != -1) {
          for (lVar11 = 0; lVar11 < pRVar4->face_per; lVar11 = lVar11 + 1) {
            pRVar5 = pRVar4->c2n;
            pRVar6 = pRVar4->f2n;
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              nodes[lVar15] =
                   pRVar5[(long)pRVar4->size_per * (long)iVar13 +
                          (long)pRVar6[(ulong)((uint)lVar11 & 0x3fffffff) * 4 + lVar15]];
            }
            uVar10 = ref_face_with(ref_face,nodes,&local_7c);
            if (uVar10 != 0) {
              uVar16 = (ulong)uVar10;
              pcVar17 = "find cell face";
              uVar14 = 300;
              goto LAB_001cc749;
            }
            piVar1 = (int *)((long)local_58 + (long)local_7c * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        iVar13 = local_4c + 1;
      }
      ppRVar12 = local_40 + local_38 + 1;
      lVar11 = local_38 + 1;
    }
    pRVar4 = ref_grid->cell[3];
    for (iVar13 = 0; iVar13 < pRVar4->max; iVar13 = iVar13 + 1) {
      pRVar5 = pRVar4->c2n;
      if (pRVar5[(long)pRVar4->size_per * (long)iVar13] != -1) {
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          nodes[lVar11] = pRVar5[(long)pRVar4->size_per * (long)iVar13 + lVar11];
        }
        nodes[3] = nodes[0];
        uVar10 = ref_face_with(ref_face,nodes,&local_7c);
        if (uVar10 != 0) {
          uVar16 = (ulong)uVar10;
          ref_node_location(ref_grid->node,nodes[0]);
          ref_node_location(ref_grid->node,nodes[1]);
          ref_node_location(ref_grid->node,nodes[2]);
          ref_node_location(ref_grid->node,nodes[3]);
          pcVar17 = "find tri";
          uVar14 = 0x13f;
          goto LAB_001cc749;
        }
        piVar1 = (int *)((long)pvVar9 + (long)local_7c * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    pRVar4 = ref_grid->cell[6];
    for (iVar13 = 0; iVar13 < pRVar4->max; iVar13 = iVar13 + 1) {
      pRVar5 = pRVar4->c2n;
      if (pRVar5[(long)pRVar4->size_per * (long)iVar13] != -1) {
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          nodes[lVar11] = pRVar5[(long)pRVar4->size_per * (long)iVar13 + lVar11];
        }
        uVar10 = ref_face_with(ref_face,nodes,&local_7c);
        if (uVar10 != 0) {
          uVar16 = (ulong)uVar10;
          ref_node_location(ref_grid->node,nodes[0]);
          ref_node_location(ref_grid->node,nodes[1]);
          ref_node_location(ref_grid->node,nodes[2]);
          ref_node_location(ref_grid->node,nodes[3]);
          pcVar17 = "find qua";
          uVar14 = 0x14f;
          goto LAB_001cc749;
        }
        piVar1 = (int *)((long)pvVar9 + (long)local_7c * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    bVar7 = 0;
    for (local_7c = 0; local_7c < ref_face->n; local_7c = local_7c + 1) {
      iVar13 = *(int *)((long)local_58 + (long)local_7c * 4);
      if (ref_grid->mpi->n < 2) {
LAB_001cca9b:
        if (iVar13 != 2) {
LAB_001ccaa4:
          printf(" hits %d\n");
          pRVar5 = ref_face->f2n;
          for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
            nodes[lVar11] = pRVar5[local_7c * 4 + lVar11];
          }
          printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n");
          uVar10 = ref_node_location(ref_grid->node,nodes[0]);
          if (uVar10 != 0) {
            uVar16 = (ulong)uVar10;
            pcVar17 = "n0";
            uVar14 = 0x16d;
            goto LAB_001cc749;
          }
          uVar10 = ref_node_location(ref_grid->node,nodes[1]);
          if (uVar10 != 0) {
            uVar16 = (ulong)uVar10;
            pcVar17 = "n1";
            uVar14 = 0x16e;
            goto LAB_001cc749;
          }
          uVar10 = ref_node_location(ref_grid->node,nodes[2]);
          if (uVar10 != 0) {
            uVar16 = (ulong)uVar10;
            pcVar17 = "n2";
            uVar14 = 0x16f;
            goto LAB_001cc749;
          }
          uVar10 = ref_node_location(ref_grid->node,nodes[3]);
          if (uVar10 != 0) {
            uVar16 = (ulong)uVar10;
            pcVar17 = "n3";
            uVar14 = 0x170;
            goto LAB_001cc749;
          }
          bVar7 = 1;
        }
      }
      else {
        pRVar5 = local_48->part;
        iVar2 = local_48->ref_mpi->id;
        pRVar6 = ref_face->f2n;
        uVar10 = local_7c * 4;
        if (((iVar2 == pRVar5[pRVar6[(int)uVar10]]) || (iVar2 == pRVar5[pRVar6[(int)(uVar10 | 1)]]))
           || (iVar2 == pRVar5[pRVar6[(int)(uVar10 | 2)]])) goto LAB_001cca9b;
        if ((iVar2 == pRVar5[pRVar6[(int)(uVar10 | 3)]]) && (iVar13 < 3)) {
          if (1 < iVar13) goto LAB_001ccc02;
          goto LAB_001ccaa4;
        }
        if ((iVar2 == pRVar5[pRVar6[(int)(uVar10 | 3)]]) || (2 < iVar13)) goto LAB_001ccaa4;
      }
LAB_001ccc02:
    }
    free(local_58);
    uVar10 = ref_face_free(ref_face);
    if (uVar10 == 0) {
      return (uint)bVar7;
    }
    uVar16 = (ulong)uVar10;
    pcVar17 = "face free";
    uVar14 = 0x176;
  }
  else {
    uVar16 = (ulong)uVar10;
    pcVar17 = "face";
    uVar14 = 0x120;
  }
LAB_001cc749:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar14,"ref_validation_cell_face",uVar16,pcVar17);
  return (REF_STATUS)uVar16;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem, report;
  REF_STATUS code;

  problem = REF_FALSE;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      problem = REF_TRUE;
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return (problem ? REF_FAILURE : REF_SUCCESS);
}